

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O2

int run_test_timer_no_double_call_nowait(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  uv_timer_t timer_handle;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,&timer_handle);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    iVar1 = uv_timer_start(&timer_handle,timer_check_double_call,10);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      uv_sleep(0x14);
      eval_a = 1;
      uVar2 = uv_default_loop();
      iVar1 = uv_run(uVar2,2);
      eval_b = (int64_t)iVar1;
      if (eval_b == 1) {
        eval_a = 1;
        eval_b = (int64_t)timer_check_double_call_called;
        if (eval_b == 1) {
          loop = (uv_loop_t *)uv_default_loop();
          close_loop(loop);
          eval_a = 0;
          uVar2 = uv_default_loop();
          iVar1 = uv_loop_close(uVar2);
          eval_b = (int64_t)iVar1;
          if (eval_b == 0) {
            uv_library_shutdown();
            return 0;
          }
          pcVar4 = "uv_loop_close(uv_default_loop())";
          pcVar3 = "0";
          uVar2 = 0x1b7;
        }
        else {
          pcVar4 = "timer_check_double_call_called";
          pcVar3 = "1";
          uVar2 = 0x1b5;
        }
      }
      else {
        pcVar4 = "uv_run(uv_default_loop(), UV_RUN_NOWAIT)";
        pcVar3 = "1";
        uVar2 = 0x1b4;
      }
    }
    else {
      pcVar4 = "0";
      pcVar3 = "uv_timer_start(&timer_handle, timer_check_double_call, timeout_ms, timeout_ms)";
      uVar2 = 0x1b2;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "uv_timer_init(uv_default_loop(), &timer_handle)";
    uVar2 = 0x1ae;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-timer.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(timer_no_double_call_nowait) {
  uv_timer_t timer_handle;
  const uint64_t timeout_ms = 10;

  ASSERT_OK(uv_timer_init(uv_default_loop(), &timer_handle));
  ASSERT_OK(uv_timer_start(&timer_handle,
                           timer_check_double_call,
                           timeout_ms,
                           timeout_ms));
  uv_sleep(timeout_ms * 2);
  ASSERT_EQ(1, uv_run(uv_default_loop(), UV_RUN_NOWAIT));
  ASSERT_EQ(1, timer_check_double_call_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}